

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O0

void PropagateExternalIncludes
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>_>
                *files)

{
  bool bVar1;
  undefined8 in_RDI;
  File **dep;
  iterator __end4;
  iterator __begin4;
  unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_> *__range4
  ;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>
  *fp;
  iterator __end2;
  iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>_>
  *__range2;
  bool foundChange;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>_>
  *in_stack_ffffffffffffffa8;
  _Node_iterator<File_*,_true,_false> *in_stack_ffffffffffffffb0;
  _Node_iterator_base<File_*,_false> local_48;
  _Node_iterator_base<File_*,_false> local_40;
  unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_> *local_38
  ;
  reference local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
  local_20;
  undefined8 local_18;
  byte local_9;
  undefined8 local_8;
  
  local_8 = in_RDI;
  do {
    local_9 = 0;
    local_18 = local_8;
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>_>
         ::begin(in_stack_ffffffffffffffa8);
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>_>
         ::end(in_stack_ffffffffffffffa8);
    while (bVar1 = std::__detail::operator!=(&local_20,&local_28), bVar1) {
      local_30 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_false,_true>
                 ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_false,_true>
                              *)0x18b7b8);
      if ((((local_30->second).hasExternalInclude & 1U) != 0) &&
         ((local_30->second).component != (Component *)0x0)) {
        local_38 = &(local_30->second).dependencies;
        local_40._M_cur =
             (__node_type *)
             std::
             unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
             ::begin((unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
                      *)in_stack_ffffffffffffffa8);
        local_48._M_cur =
             (__node_type *)
             std::
             unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
             ::end((unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
                    *)in_stack_ffffffffffffffa8);
        while (bVar1 = std::__detail::operator!=(&local_40,&local_48), bVar1) {
          in_stack_ffffffffffffffb0 =
               (_Node_iterator<File_*,_true,_false> *)
               std::__detail::_Node_iterator<File_*,_true,_false>::operator*
                         ((_Node_iterator<File_*,_true,_false> *)0x18b831);
          if ((((in_stack_ffffffffffffffb0->super__Node_iterator_base<File_*,_false>)._M_cur[0xd].
                super__Hash_node_value<File_*,_false>.super__Hash_node_value_base<File_*>._M_storage
                ._M_storage.__data[0] & 1) == 0) &&
             ((Component *)
              (in_stack_ffffffffffffffb0->super__Node_iterator_base<File_*,_false>)._M_cur[0xc].
              super__Hash_node_base._M_nxt == (local_30->second).component)) {
            (in_stack_ffffffffffffffb0->super__Node_iterator_base<File_*,_false>)._M_cur[0xd].
            super__Hash_node_value<File_*,_false>.super__Hash_node_value_base<File_*>._M_storage.
            _M_storage.__data[0] = '\x01';
            local_9 = 1;
          }
          std::__detail::_Node_iterator<File_*,_true,_false>::operator++(in_stack_ffffffffffffffb0);
        }
      }
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_false,_true>
                    *)in_stack_ffffffffffffffb0);
    }
  } while ((local_9 & 1) != 0);
  return;
}

Assistant:

void PropagateExternalIncludes(std::unordered_map<std::string, File>& files) {
    bool foundChange;
    do {
        foundChange = false;
        for (auto &fp : files) {
            if (fp.second.hasExternalInclude && fp.second.component) {
                for (auto &dep : fp.second.dependencies) {
                    if (!dep->hasExternalInclude && dep->component == fp.second.component) {
                        dep->hasExternalInclude = true;
                        foundChange = true;
                    }
                }
            }
        }
    } while (foundChange);
}